

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

void __thiscall helics::InterfaceInfo::getUnconnectedInterfaces(InterfaceInfo *this,json *base)

{
  value_t vVar1;
  json_value jVar2;
  pointer puVar3;
  InputInfo *pIVar4;
  pointer puVar5;
  PublicationInfo *pPVar6;
  pointer puVar7;
  EndpointInfo *this_00;
  bool bVar8;
  reference pvVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  data dStack_c8;
  pthread_rwlock_t *local_b8;
  pthread_rwlock_t *local_b0;
  pthread_rwlock_t *local_a8;
  data local_a0;
  data local_90;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  local_a8 = (pthread_rwlock_t *)&(this->inputs).m_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_a8->__data);
  if ((this->inputs).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->inputs).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"unconnected_inputs");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_40.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_40.m_value;
    local_40.m_type = vVar1;
    local_40.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_50,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"connected_inputs");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_50.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_50.m_value;
    local_50.m_type = vVar1;
    local_50.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_50);
    puVar3 = (this->inputs).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->inputs).m_obj.dataStorage.
                   super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
        puVar10 = puVar10 + 1) {
      pIVar4 = (puVar10->_M_t).
               super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>.
               super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
      if ((pIVar4->key)._M_string_length != 0) {
        if (pIVar4->has_target == false) {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)base,"unconnected_inputs");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar10->_M_t).
                       super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                       .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->key);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&dStack_c8);
        }
        else {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)base,"connected_inputs");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar10->_M_t).
                       super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                       .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->key);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&dStack_c8);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&dStack_c8);
      }
    }
  }
  pthread_rwlock_unlock(local_a8);
  local_b0 = (pthread_rwlock_t *)&(this->publications).m_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_b0->__data);
  if ((this->publications).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->publications).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_60,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"unconnected_publications");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_60.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_60.m_value;
    local_60.m_type = vVar1;
    local_60.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_60);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_70,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"connected_publications");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_70.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_70.m_value;
    local_70.m_type = vVar1;
    local_70.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_70);
    puVar5 = (this->publications).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->publications).m_obj.dataStorage.
                   super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar5;
        puVar11 = puVar11 + 1) {
      pPVar6 = (puVar11->_M_t).
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl;
      if ((pPVar6->key)._M_string_length != 0) {
        if (*(pointer *)
             &(pPVar6->subscribers).
              super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              ._M_impl ==
            *(pointer *)
             ((long)&(pPVar6->subscribers).
                     super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             + 8)) {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)base,"unconnected_publications");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar11->_M_t).
                       super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
                       .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl)->key);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&dStack_c8);
        }
        else {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)base,"connected_publications");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar11->_M_t).
                       super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
                       .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl)->key);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&dStack_c8);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&dStack_c8);
      }
    }
  }
  pthread_rwlock_unlock(local_b0);
  local_b8 = (pthread_rwlock_t *)&(this->endpoints).m_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_b8->__data);
  if ((this->endpoints).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->endpoints).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_80,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"unconnected_source_endpoints");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_80.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_80.m_value;
    local_80.m_type = vVar1;
    local_80.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_80);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_90,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"unconnected_destination_endpoints");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_90.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_90.m_value;
    local_90.m_type = vVar1;
    local_90.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_90);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_a0,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)base,"connected_endpoints");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_a0.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_a0.m_value;
    local_a0.m_type = vVar1;
    local_a0.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_a0);
    puVar7 = (this->endpoints).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->endpoints).m_obj.dataStorage.
                   super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar7;
        puVar12 = puVar12 + 1) {
      this_00 = (puVar12->_M_t).
                super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl;
      if ((this_00->key)._M_string_length != 0) {
        if (this_00->targetedEndpoint == true) {
          bVar8 = EndpointInfo::hasSource(this_00);
          if (!bVar8) {
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)base,"unconnected_target_endpoints");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&dStack_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((puVar12->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->key);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&dStack_c8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&dStack_c8);
          }
          bVar8 = EndpointInfo::hasTarget
                            ((puVar12->_M_t).
                             super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                             .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl);
          if (!bVar8) {
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)base,"unconnected_source_endpoints");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&dStack_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((puVar12->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->key);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&dStack_c8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&dStack_c8);
          }
          bVar8 = EndpointInfo::hasConnection
                            ((puVar12->_M_t).
                             super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                             .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl);
          if (!bVar8) goto LAB_002d7652;
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)base,"connected_endpoints");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar12->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->key);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&dStack_c8);
        }
        else {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)base,"connected_endpoints");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar12->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->key);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&dStack_c8);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&dStack_c8);
      }
LAB_002d7652:
    }
  }
  pthread_rwlock_unlock(local_b8);
  return;
}

Assistant:

void InterfaceInfo::getUnconnectedInterfaces(nlohmann::json& base) const
{
    auto ihandle = inputs.lock_shared();
    if (ihandle->size() > 0) {
        base["unconnected_inputs"] = nlohmann::json::array();
        base["connected_inputs"] = nlohmann::json::array();
        for (const auto& ipt : ihandle) {
            if (!ipt->key.empty()) {
                if (!ipt->has_target) {
                    base["unconnected_inputs"].push_back(ipt->key);
                } else {
                    base["connected_inputs"].push_back(ipt->key);
                }
            }
        }
    }
    ihandle.unlock();
    auto phandle = publications.lock();
    if (phandle->size() > 0) {
        base["unconnected_publications"] = nlohmann::json::array();
        base["connected_publications"] = nlohmann::json::array();
        for (const auto& pub : phandle) {
            if (!pub->key.empty()) {
                if (pub->subscribers.empty()) {
                    base["unconnected_publications"].push_back(pub->key);
                } else {
                    base["connected_publications"].push_back(pub->key);
                }
            }
        }
    }
    phandle.unlock();

    auto ehandle = endpoints.lock_shared();
    if (ehandle->size() > 0) {
        base["unconnected_source_endpoints"] = nlohmann::json::array();
        base["unconnected_destination_endpoints"] = nlohmann::json::array();
        base["connected_endpoints"] = nlohmann::json::array();
        for (const auto& ept : ehandle) {
            if (!ept->key.empty()) {
                if (ept->targetedEndpoint) {
                    if (!ept->hasSource()) {
                        base["unconnected_target_endpoints"].push_back(ept->key);
                    }
                    if (!ept->hasTarget()) {
                        base["unconnected_source_endpoints"].push_back(ept->key);
                    }
                    if (ept->hasConnection()) {
                        base["connected_endpoints"].push_back(ept->key);
                    }
                } else {
                    base["connected_endpoints"].push_back(ept->key);
                }
            }
        }
    }
    ehandle.unlock();
}